

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
               (HighsDomainChange *begin,HighsDomainChange *end)

{
  HighsDomainChange *this;
  HighsInt HVar1;
  HighsBoundType HVar2;
  bool bVar3;
  long lVar4;
  HighsDomainChange *pHVar5;
  long lVar6;
  HighsDomainChange *pHVar7;
  T tmp;
  HighsDomainChange local_48;
  
  if (begin != end) {
    lVar6 = 0;
    pHVar5 = begin;
    while (this = pHVar5 + 1, this != end) {
      bVar3 = HighsDomainChange::operator<(this,pHVar5);
      if (bVar3) {
        local_48.boundval = this->boundval;
        local_48.column = pHVar5[1].column;
        local_48.boundtype = pHVar5[1].boundtype;
        lVar4 = lVar6;
        pHVar5 = this;
        do {
          HVar1 = pHVar5[-1].column;
          HVar2 = pHVar5[-1].boundtype;
          pHVar5->boundval = pHVar5[-1].boundval;
          pHVar5->column = HVar1;
          pHVar5->boundtype = HVar2;
          pHVar7 = begin;
          if (lVar4 == 0) break;
          pHVar7 = pHVar5 + -1;
          bVar3 = HighsDomainChange::operator<(&local_48,pHVar5 + -2);
          lVar4 = lVar4 + 0x10;
          pHVar5 = pHVar7;
        } while (bVar3);
        pHVar7->boundval = local_48.boundval;
        pHVar7->column = local_48.column;
        pHVar7->boundtype = local_48.boundtype;
      }
      lVar6 = lVar6 + -0x10;
      pHVar5 = this;
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }